

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

ExactFloat * __thiscall ExactFloat::operator=(ExactFloat *this,ExactFloat *b)

{
  int32 iVar1;
  
  if (this != b) {
    iVar1 = b->bn_exp_;
    this->sign_ = b->sign_;
    this->bn_exp_ = iVar1;
    BN_copy((BIGNUM *)(this->bn_).bn_,(BIGNUM *)(b->bn_).bn_);
  }
  return this;
}

Assistant:

ExactFloat& ExactFloat::operator=(const ExactFloat& b) {
  if (this != &b) {
    sign_ = b.sign_;
    bn_exp_ = b.bn_exp_;
    BN_copy(bn_.get(), b.bn_.get());
  }
  return *this;
}